

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

void release_thread_cache(void *p)

{
  uint uVar1;
  long *plVar2;
  CentralCache *cc_00;
  ulong uVar3;
  long *in_FS_OFFSET;
  CentralCache *cc;
  FreeBlock *pFStack_28;
  uint freeListSize;
  FreeBlock *tail;
  ThreadCache *tc;
  uint sizeClass;
  void *p_local;
  
  tc._4_4_ = 0;
  do {
    if (0x103 < tc._4_4_) {
      return;
    }
    plVar2 = (long *)(*in_FS_OFFSET + -0x1870 + (ulong)tc._4_4_ * 0x18);
    if ((*plVar2 != 0) || (plVar2[1] != 0)) {
      pFStack_28 = (FreeBlock *)*plVar2;
      cc._4_4_ = 1;
      uVar3 = (ulong)tc._4_4_;
      cc_00 = centralCache + uVar3;
      if (pFStack_28 != (FreeBlock *)0x0) {
        for (; pFStack_28->next != (FreeBlock *)0x0; pFStack_28 = pFStack_28->next) {
          cc._4_4_ = cc._4_4_ + 1;
        }
      }
      spinlock_acquire(&cc_00->lock);
      if (plVar2[1] != 0) {
        add_batch_to_central_cache(cc_00,tc._4_4_,(FreeBlock *)plVar2[1]);
      }
      if (*plVar2 != 0) {
        pFStack_28->next = centralCache[uVar3].freeList;
        check_block_next(pFStack_28);
        centralCache[uVar3].freeList = (FreeBlock *)*plVar2;
        uVar1 = batch_size(tc._4_4_);
        if (cc._4_4_ != (uVar1 + 1) - (int)plVar2[2]) {
          __assert_fail("freeListSize == batch_size(sizeClass) + 1 - tc->counter",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                        ,0x44d,"void release_thread_cache(void *)");
        }
        centralCache[uVar3].freeListSize = cc._4_4_ + centralCache[uVar3].freeListSize;
      }
      cc_00->lock = 0;
      *plVar2 = 0;
      plVar2[1] = 0;
      *(undefined4 *)(plVar2 + 2) = 0;
    }
    tc._4_4_ = tc._4_4_ + 1;
  } while( true );
}

Assistant:

static void release_thread_cache(void* p)
{
	unsigned int sizeClass = 0; (void)p;
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		ThreadCache* tc = &threadCache[sizeClass];
		if (tc->freeList || tc->tempList)
		{
			FreeBlock* tail = tc->freeList;
			unsigned int freeListSize = 1;
			CentralCache* cc = &centralCache[sizeClass];

			if (tail)
				while (tail->next)//search for end of list
					tail = tail->next, freeListSize++;

			SPINLOCK_ACQUIRE(&cc->lock);
			if (tc->tempList)
				add_batch_to_central_cache(cc, sizeClass, tc->tempList);
			if (tc->freeList) {//append tc->freeList to cc->freeList
				tail->next = cc->freeList;
				check_block_next(tail);
				cc->freeList = tc->freeList;
				LTALLOC_ASSERT(freeListSize == batch_size(sizeClass) + 1 - tc->counter);
				cc->freeListSize += freeListSize;
			}
			SPINLOCK_RELEASE(&cc->lock);

			tc->freeList = NULL;
			tc->tempList = NULL;
			tc->counter = 0;
		}
	}
}